

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleARGBColsUp2_SSE2(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_argb_local;
  uint8_t *dst_argb_local;
  
  do {
    uVar2 = *(undefined4 *)src_argb;
    uVar3 = *(undefined4 *)(src_argb + 4);
    uVar4 = *(undefined4 *)(src_argb + 8);
    uVar5 = *(undefined4 *)(src_argb + 0xc);
    src_argb = src_argb + 0x10;
    *(undefined4 *)dst_argb = uVar2;
    *(undefined4 *)(dst_argb + 4) = uVar2;
    *(undefined4 *)(dst_argb + 8) = uVar3;
    *(undefined4 *)(dst_argb + 0xc) = uVar3;
    *(undefined4 *)(dst_argb + 0x10) = uVar4;
    *(undefined4 *)(dst_argb + 0x14) = uVar4;
    *(undefined4 *)(dst_argb + 0x18) = uVar5;
    *(undefined4 *)(dst_argb + 0x1c) = uVar5;
    dst_argb = dst_argb + 0x20;
    iVar6 = dst_width + -8;
    bVar1 = 7 < dst_width;
    dst_width = iVar6;
  } while (iVar6 != 0 && bVar1);
  return;
}

Assistant:

void ScaleARGBColsUp2_SSE2(uint8_t* dst_argb,
                           const uint8_t* src_argb,
                           int dst_width,
                           int x,
                           int dx) {
  (void)x;
  (void)dx;
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%1),%%xmm0                   \n"
      "lea         0x10(%1),%1                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpckldq   %%xmm0,%%xmm0                 \n"
      "punpckhdq   %%xmm1,%%xmm1                 \n"
      "movdqu      %%xmm0,(%0)                   \n"
      "movdqu      %%xmm1,0x10(%0)               \n"
      "lea         0x20(%0),%0                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"

      : "+r"(dst_argb),  // %0
        "+r"(src_argb),  // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1");
}